

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.cpp
# Opt level: O3

uint __thiscall xercesc_4_0::XMLStringPool::addNewEntry(XMLStringPool *this,XMLCh *newString)

{
  short *psVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  PoolElem *valueToAdopt;
  XMLCh *__dest;
  size_t __n;
  ulong uVar4;
  PoolElem **__s;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (this->fCurId == this->fMapCapacity) {
    uVar4 = (ulong)((double)this->fCurId * 1.5);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
    __s = (PoolElem **)CONCAT44(extraout_var,iVar3);
    memset(__s,0,(uVar4 & 0xffffffff) << 3);
    memcpy(__s,this->fIdMap,(ulong)this->fMapCapacity << 3);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fIdMap);
    this->fIdMap = __s;
    this->fMapCapacity = (uint)uVar4;
  }
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x10);
  valueToAdopt = (PoolElem *)CONCAT44(extraout_var_00,iVar3);
  valueToAdopt->fId = this->fCurId;
  if (newString == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)newString + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
    memcpy(__dest,newString,__n);
  }
  valueToAdopt->fString = __dest;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher>::put
            (this->fHashTable,__dest,valueToAdopt);
  uVar2 = this->fCurId;
  this->fIdMap[uVar2] = valueToAdopt;
  this->fCurId = uVar2 + 1;
  return valueToAdopt->fId;
}

Assistant:

unsigned int XMLStringPool::addNewEntry(const XMLCh* const newString)
{
    // See if we need to expand the id map
    if (fCurId == fMapCapacity)
    {
        // Calculate the new capacity, create a temp new map, and zero it
        const unsigned int newCap = (unsigned int)(fMapCapacity * 1.5);
        PoolElem** newMap = (PoolElem**) fMemoryManager->allocate
        (
            newCap * sizeof(PoolElem*)
        ); //new PoolElem*[newCap];
        memset(newMap, 0, sizeof(PoolElem*) * newCap);

        //
        //  Copy over the old elements from the old map. They are just pointers
        //  so we can do it all at once.
        //
        memcpy(newMap, fIdMap, sizeof(PoolElem*) * fMapCapacity);

        // Clean up the old map and store the new info
        fMemoryManager->deallocate(fIdMap); //delete [] fIdMap;
        fIdMap = newMap;
        fMapCapacity = newCap;
    }

    //
    //  Ok, now create a new element and add it to the hash table. Then store
    //  this new element in the id map at the current id index, then bump the
    //  id index.
    //
    PoolElem* newElem = (PoolElem*) fMemoryManager->allocate(sizeof(PoolElem));
    newElem->fId      = fCurId;
    newElem->fString  = XMLString::replicate(newString, fMemoryManager);
    fHashTable->put((void*)newElem->fString, newElem);
    fIdMap[fCurId] = newElem;

    // Bump the current id and return the id of the new elem we just added
    fCurId++;
    return newElem->fId;
}